

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void NULLCFile::FileSeek(int dir,int shift,File *file)

{
  char *error;
  
  if (file == (File *)0x0) {
    error = "ERROR: null pointer access";
  }
  else {
    if ((FILE *)file->handle != (FILE *)0x0) {
      fseek((FILE *)file->handle,(long)shift,dir);
      return;
    }
    error = "Cannot seek in a closed file.";
  }
  nullcThrowError(error);
  return;
}

Assistant:

void FileSeek(int dir, int shift, File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot seek in a closed file.");
			return;
		}

		fseek(file->handle, shift, dir);
	}